

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::InstanceIntersectorK<4>_>,_false>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar1;
  undefined4 uVar2;
  size_t sVar3;
  undefined1 auVar4 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar5;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  NodeRef nodeRef;
  ulong uVar9;
  long lVar10;
  size_t sVar11;
  NodeRef *pNVar12;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar13;
  ulong uVar14;
  size_t sVar15;
  Primitive *prim;
  bool bVar16;
  vint4 ai_2;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [64];
  float fVar27;
  float fVar31;
  float fVar32;
  undefined1 auVar28 [16];
  float fVar33;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar34;
  vint4 ai;
  undefined1 auVar35 [16];
  float fVar39;
  undefined1 auVar36 [16];
  float fVar37;
  float fVar38;
  undefined1 in_ZMM2 [64];
  float fVar40;
  float fVar43;
  float fVar44;
  vint4 ai_1;
  undefined1 auVar41 [16];
  float fVar45;
  undefined1 auVar42 [16];
  vint4 ai_3;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  vint4 bi;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  vint4 bi_1;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  vint4 bi_3;
  undefined1 auVar52 [16];
  vint4 bi_2;
  undefined1 auVar53 [16];
  undefined1 auVar55 [64];
  Precalculations pre;
  vint4 bi_8;
  vbool<4> valid0;
  InstanceIntersectorK<4> local_16e8 [16];
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  undefined1 auVar54 [64];
  
  sVar15 = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (sVar15 != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar25 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    auVar30 = vpcmpeqd_avx(auVar25,(undefined1  [16])valid_i->field_0);
    auVar7 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),ZEXT816(0) << 0x40,5);
    auVar8 = auVar30 & auVar7;
    if ((((auVar8 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar8 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar8 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar8[0xf] < '\0') {
      auVar4 = vandps_avx(auVar7,auVar30);
      auVar7 = *(undefined1 (*) [16])ray;
      auVar30 = *(undefined1 (*) [16])(ray + 0x10);
      auVar8 = *(undefined1 (*) [16])(ray + 0x20);
      auVar53 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),ZEXT816(0) << 0x40);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar55 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      aVar6.v = (__m128)vblendvps_avx(stack_near[0].field_0,auVar53,auVar4);
      auVar53._0_4_ = auVar4._0_4_ ^ auVar25._0_4_;
      auVar53._4_4_ = auVar4._4_4_ ^ auVar25._4_4_;
      auVar53._8_4_ = auVar4._8_4_ ^ auVar25._8_4_;
      auVar53._12_4_ = auVar4._12_4_ ^ auVar25._12_4_;
      auVar54 = ZEXT1664(auVar53);
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_node[1].ptr = sVar15;
      stack_near[1].field_0 = aVar6;
      if (sVar15 != 0xfffffffffffffff8) {
        auVar35._8_4_ = 0x7fffffff;
        auVar35._0_8_ = 0x7fffffff7fffffff;
        auVar35._12_4_ = 0x7fffffff;
        auVar25 = vandps_avx(*(undefined1 (*) [16])(ray + 0x40),auVar35);
        auVar50._8_4_ = 0x219392ef;
        auVar50._0_8_ = 0x219392ef219392ef;
        auVar50._12_4_ = 0x219392ef;
        auVar25 = vcmpps_avx(auVar25,auVar50,1);
        auVar53 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x40),auVar50,auVar25);
        auVar25 = vandps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar35);
        auVar25 = vcmpps_avx(auVar25,auVar50,1);
        auVar29 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar50,auVar25);
        auVar25 = vandps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar35);
        auVar25 = vcmpps_avx(auVar25,auVar50,1);
        auVar25 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar50,auVar25);
        auVar35 = vrcpps_avx(auVar53);
        fVar34 = auVar35._0_4_;
        auVar46._0_4_ = auVar53._0_4_ * fVar34;
        fVar37 = auVar35._4_4_;
        auVar46._4_4_ = auVar53._4_4_ * fVar37;
        fVar38 = auVar35._8_4_;
        auVar46._8_4_ = auVar53._8_4_ * fVar38;
        fVar39 = auVar35._12_4_;
        auVar46._12_4_ = auVar53._12_4_ * fVar39;
        auVar48._8_4_ = 0x3f800000;
        auVar48._0_8_ = 0x3f8000003f800000;
        auVar48._12_4_ = 0x3f800000;
        auVar35 = vsubps_avx(auVar48,auVar46);
        auVar53 = vrcpps_avx(auVar29);
        fVar40 = auVar53._0_4_;
        auVar41._0_4_ = auVar29._0_4_ * fVar40;
        fVar43 = auVar53._4_4_;
        auVar41._4_4_ = auVar29._4_4_ * fVar43;
        fVar44 = auVar53._8_4_;
        auVar41._8_4_ = auVar29._8_4_ * fVar44;
        fVar45 = auVar53._12_4_;
        auVar41._12_4_ = auVar29._12_4_ * fVar45;
        auVar29 = vsubps_avx(auVar48,auVar41);
        auVar53 = vrcpps_avx(auVar25);
        fVar27 = auVar53._0_4_;
        auVar28._0_4_ = auVar25._0_4_ * fVar27;
        fVar31 = auVar53._4_4_;
        auVar28._4_4_ = auVar25._4_4_ * fVar31;
        fVar32 = auVar53._8_4_;
        auVar28._8_4_ = auVar25._8_4_ * fVar32;
        fVar33 = auVar53._12_4_;
        auVar28._12_4_ = auVar25._12_4_ * fVar33;
        auVar25 = vsubps_avx(auVar48,auVar28);
        fVar40 = fVar40 + fVar40 * auVar29._0_4_;
        fVar43 = fVar43 + fVar43 * auVar29._4_4_;
        fVar44 = fVar44 + fVar44 * auVar29._8_4_;
        fVar45 = fVar45 + fVar45 * auVar29._12_4_;
        fVar34 = fVar34 + fVar34 * auVar35._0_4_;
        fVar37 = fVar37 + fVar37 * auVar35._4_4_;
        fVar38 = fVar38 + fVar38 * auVar35._8_4_;
        fVar39 = fVar39 + fVar39 * auVar35._12_4_;
        fVar27 = fVar27 + fVar27 * auVar25._0_4_;
        fVar31 = fVar31 + fVar31 * auVar25._4_4_;
        fVar32 = fVar32 + fVar32 * auVar25._8_4_;
        fVar33 = fVar33 + fVar33 * auVar25._12_4_;
        auVar25 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),ZEXT416(0) << 0x20);
        auVar29._8_4_ = 0xff800000;
        auVar29._0_8_ = 0xff800000ff800000;
        auVar29._12_4_ = 0xff800000;
        bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                       vblendvps_avx(auVar29,auVar25,auVar4);
        pNVar12 = stack_node + 1;
        paVar13 = &stack_near[2].field_0;
LAB_00307752:
        auVar53 = auVar54._0_16_;
        paVar1 = paVar13 + -1;
        auVar26 = ZEXT1664((undefined1  [16])*paVar1);
        paVar13 = paVar13 + -1;
        auVar25 = vcmpps_avx((undefined1  [16])*paVar1,(undefined1  [16])bi_8.field_0,1);
        if ((((auVar25 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar25 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar25 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar25[0xf] < '\0') {
          do {
            if ((sVar15 & 8) != 0) {
              if (sVar15 == 0xfffffffffffffff8) goto LAB_003079d5;
              auVar25 = vcmpps_avx((undefined1  [16])bi_8.field_0,auVar26._0_16_,6);
              if ((((auVar25 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar25 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar25 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar25[0xf] < '\0') {
                uVar9 = (ulong)((uint)sVar15 & 0xf);
                auVar25 = vpcmpeqd_avx((undefined1  [16])bi_8.field_0,(undefined1  [16])bi_8.field_0
                                      );
                valid0.field_0.i[1] = auVar54._4_4_ ^ auVar25._4_4_;
                valid0.field_0.i[0] = auVar54._0_4_ ^ auVar25._0_4_;
                valid0.field_0.i[2] = auVar54._8_4_ ^ auVar25._8_4_;
                valid0.field_0.i[3] = auVar54._12_4_ ^ auVar25._12_4_;
                auVar24 = auVar53;
                if (uVar9 == 8) goto LAB_003079aa;
                prim = (Primitive *)(sVar15 & 0xfffffffffffffff0);
                uVar14 = 1;
                goto LAB_00307918;
              }
              break;
            }
            lVar10 = 0;
            sVar11 = 8;
            aVar23 = auVar55._0_16_;
            do {
              sVar3 = *(size_t *)((sVar15 & 0xfffffffffffffff0) + lVar10 * 8);
              if (sVar3 == 8) {
                auVar26 = ZEXT1664((undefined1  [16])aVar23);
                break;
              }
              uVar2 = *(undefined4 *)(sVar15 + 0x20 + lVar10 * 4);
              auVar17._4_4_ = uVar2;
              auVar17._0_4_ = uVar2;
              auVar17._8_4_ = uVar2;
              auVar17._12_4_ = uVar2;
              auVar25 = vsubps_avx(auVar17,auVar7);
              auVar36._0_4_ = fVar34 * auVar25._0_4_;
              auVar36._4_4_ = fVar37 * auVar25._4_4_;
              auVar36._8_4_ = fVar38 * auVar25._8_4_;
              auVar36._12_4_ = fVar39 * auVar25._12_4_;
              uVar2 = *(undefined4 *)(sVar15 + 0x40 + lVar10 * 4);
              auVar18._4_4_ = uVar2;
              auVar18._0_4_ = uVar2;
              auVar18._8_4_ = uVar2;
              auVar18._12_4_ = uVar2;
              auVar25 = vsubps_avx(auVar18,auVar30);
              auVar42._0_4_ = fVar40 * auVar25._0_4_;
              auVar42._4_4_ = fVar43 * auVar25._4_4_;
              auVar42._8_4_ = fVar44 * auVar25._8_4_;
              auVar42._12_4_ = fVar45 * auVar25._12_4_;
              uVar2 = *(undefined4 *)(sVar15 + 0x60 + lVar10 * 4);
              auVar19._4_4_ = uVar2;
              auVar19._0_4_ = uVar2;
              auVar19._8_4_ = uVar2;
              auVar19._12_4_ = uVar2;
              auVar25 = vsubps_avx(auVar19,auVar8);
              auVar47._0_4_ = fVar27 * auVar25._0_4_;
              auVar47._4_4_ = fVar31 * auVar25._4_4_;
              auVar47._8_4_ = fVar32 * auVar25._8_4_;
              auVar47._12_4_ = fVar33 * auVar25._12_4_;
              uVar2 = *(undefined4 *)(sVar15 + 0x30 + lVar10 * 4);
              auVar20._4_4_ = uVar2;
              auVar20._0_4_ = uVar2;
              auVar20._8_4_ = uVar2;
              auVar20._12_4_ = uVar2;
              auVar25 = vsubps_avx(auVar20,auVar7);
              auVar49._0_4_ = fVar34 * auVar25._0_4_;
              auVar49._4_4_ = fVar37 * auVar25._4_4_;
              auVar49._8_4_ = fVar38 * auVar25._8_4_;
              auVar49._12_4_ = fVar39 * auVar25._12_4_;
              uVar2 = *(undefined4 *)(sVar15 + 0x50 + lVar10 * 4);
              auVar21._4_4_ = uVar2;
              auVar21._0_4_ = uVar2;
              auVar21._8_4_ = uVar2;
              auVar21._12_4_ = uVar2;
              auVar25 = vsubps_avx(auVar21,auVar30);
              auVar51._0_4_ = fVar40 * auVar25._0_4_;
              auVar51._4_4_ = fVar43 * auVar25._4_4_;
              auVar51._8_4_ = fVar44 * auVar25._8_4_;
              auVar51._12_4_ = fVar45 * auVar25._12_4_;
              uVar2 = *(undefined4 *)(sVar15 + 0x70 + lVar10 * 4);
              auVar22._4_4_ = uVar2;
              auVar22._0_4_ = uVar2;
              auVar22._8_4_ = uVar2;
              auVar22._12_4_ = uVar2;
              auVar25 = vsubps_avx(auVar22,auVar8);
              auVar52._0_4_ = fVar27 * auVar25._0_4_;
              auVar52._4_4_ = fVar31 * auVar25._4_4_;
              auVar52._8_4_ = fVar32 * auVar25._8_4_;
              auVar52._12_4_ = fVar33 * auVar25._12_4_;
              auVar25 = vpminsd_avx(auVar36,auVar49);
              auVar29 = vpminsd_avx(auVar42,auVar51);
              auVar25 = vpmaxsd_avx(auVar25,auVar29);
              auVar29 = vpminsd_avx(auVar47,auVar52);
              auVar29 = vpmaxsd_avx(auVar25,auVar29);
              auVar25 = vpmaxsd_avx(auVar36,auVar49);
              auVar35 = vpmaxsd_avx(auVar42,auVar51);
              auVar28 = vpminsd_avx(auVar25,auVar35);
              auVar25 = vpmaxsd_avx(auVar47,auVar52);
              auVar35 = vpmaxsd_avx(auVar29,(undefined1  [16])aVar6);
              auVar25 = vpminsd_avx(auVar25,(undefined1  [16])bi_8.field_0);
              auVar25 = vpminsd_avx(auVar28,auVar25);
              auVar25 = vcmpps_avx(auVar35,auVar25,2);
              if ((((auVar25 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar25 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar25 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar25[0xf]) {
                auVar26 = ZEXT1664((undefined1  [16])aVar23);
                sVar3 = sVar11;
              }
              else {
                auVar25 = vblendvps_avx((undefined1  [16])auVar55._0_16_,auVar29,auVar25);
                auVar26 = ZEXT1664(auVar25);
                if (sVar11 != 8) {
                  pNVar12->ptr = sVar11;
                  pNVar12 = pNVar12 + 1;
                  *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar13->v = aVar23;
                  paVar13 = paVar13 + 1;
                }
              }
              sVar11 = sVar3;
              lVar10 = lVar10 + 1;
              aVar23 = auVar26._0_16_;
            } while (lVar10 != 4);
            sVar15 = sVar11;
          } while (sVar11 != 8);
        }
        goto LAB_003078ac;
      }
LAB_003079d5:
      auVar7 = vandps_avx(auVar4,auVar53);
      auVar30._8_4_ = 0xff800000;
      auVar30._0_8_ = 0xff800000ff800000;
      auVar30._12_4_ = 0xff800000;
      auVar7 = vmaskmovps_avx(auVar7,auVar30);
      *(undefined1 (*) [16])(ray + 0x80) = auVar7;
    }
  }
  return;
  while( true ) {
    prim = prim + 1;
    bVar16 = uVar9 - 8 <= uVar14;
    uVar14 = uVar14 + 1;
    valid0.field_0 = aVar5;
    if (bVar16) break;
LAB_00307918:
    InstanceIntersectorK<4>::occluded(local_16e8,&valid0,&pre,ray,context,prim);
    aVar5.v = (__m128)vandnps_avx((undefined1  [16])local_16e8,valid0.field_0);
    auVar25 = (undefined1  [16])valid0.field_0 & ~(undefined1  [16])local_16e8;
    if ((((auVar25 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar25 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar25 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar25[0xf])
    break;
  }
  auVar25 = vpcmpeqd_avx((undefined1  [16])local_16e8,(undefined1  [16])local_16e8);
  auVar24._0_4_ = aVar5.i[0] ^ auVar25._0_4_;
  auVar24._4_4_ = aVar5.i[1] ^ auVar25._4_4_;
  auVar24._8_4_ = aVar5.i[2] ^ auVar25._8_4_;
  auVar24._12_4_ = aVar5.i[3] ^ auVar25._12_4_;
  auVar55 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
LAB_003079aa:
  auVar53 = vorps_avx(auVar53,auVar24);
  auVar54 = ZEXT1664(auVar53);
  auVar25 = auVar25 & ~auVar53;
  if ((((auVar25 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar25 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar25 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar25[0xf])
  goto LAB_003079d5;
  auVar25._8_4_ = 0xff800000;
  auVar25._0_8_ = 0xff800000ff800000;
  auVar25._12_4_ = 0xff800000;
  bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                 vblendvps_avx((undefined1  [16])bi_8.field_0,auVar25,auVar53);
LAB_003078ac:
  auVar53 = auVar54._0_16_;
  sVar15 = pNVar12[-1].ptr;
  pNVar12 = pNVar12 + -1;
  if (sVar15 == 0xfffffffffffffff8) goto LAB_003079d5;
  goto LAB_00307752;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }